

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabularDataFile.cpp
# Opt level: O2

TabularDataFile * __thiscall
asl::TabularDataFile::columns(TabularDataFile *this,Array<asl::String> *cols)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  TextFile *pTVar6;
  String *pSVar7;
  anon_union_16_2_78e7fdac_for_String_2 *paVar8;
  ulong uVar9;
  char *s;
  Array<asl::String> parts_1;
  Array<asl::String> parts;
  String rel;
  String local_60;
  String local_48;
  
  if (this->_separator == '\0') {
    this->_separator = ',';
  }
  if (*(int *)&(this->_columnNames)._a[-1].field_2 == 0) {
    TextFile::open(&this->_file,(char *)&this->_name,1);
    if ((this->_file).super_File._file == (FILE *)0x0) {
      return this;
    }
    for (uVar9 = (ulong)*(uint *)&cols->_a[-1].field_2 << 0x20; iVar5 = (int)uVar9,
        iVar5 < (int)(uVar9 >> 0x20); uVar9 = uVar9 & 0xffffffff00000000 | (ulong)(iVar5 + 1)) {
      pSVar7 = cols->_a;
      String::String(&rel,':');
      String::split((String *)&parts,pSVar7 + iVar5);
      String::~String(&rel);
      Array<asl::String>::operator<<(&this->_columnNames,parts._a);
      Array<asl::String>::~Array(&parts);
    }
  }
  pSVar7 = &this->_name;
  String::toLowerCase(&rel,pSVar7);
  bVar2 = String::endsWith(&rel,".arff");
  String::~String(&rel);
  if (bVar2) {
    this->_quote = '\'';
    String::repeat(&rel,'\'',2);
    String::operator=(&this->_equote,&rel);
    String::~String(&rel);
    iVar3 = String::lastIndexOf(pSVar7,'/');
    iVar4 = String::lastIndexOf(pSVar7,'\\');
    iVar5 = iVar4 + 1;
    if (iVar4 + 1 < iVar3 + 1) {
      iVar5 = iVar3 + 1;
    }
    iVar3 = 0;
    if (0 < iVar5) {
      iVar3 = iVar5;
    }
    iVar5 = String::lastIndexOf(pSVar7,'.');
    String::substring(&rel,pSVar7,iVar3,iVar5);
    pTVar6 = TextFile::operator<<(&this->_file,"@relation ");
    pTVar6 = TextFile::operator<<(pTVar6,&rel);
    TextFile::operator<<(pTVar6,"\n\n");
    for (uVar9 = (ulong)*(uint *)&cols->_a[-1].field_2 << 0x20; iVar5 = (int)uVar9,
        iVar5 < (int)(uVar9 >> 0x20); uVar9 = uVar9 & 0xffffffff00000000 | (ulong)(iVar5 + 1)) {
      pSVar7 = cols->_a;
      String::String((String *)&parts,':');
      String::split((String *)&parts_1,pSVar7 + iVar5);
      String::~String((String *)&parts);
      if (*(int *)&parts_1._a[-1].field_2 == 1) {
LAB_0013c421:
        s = "numeric";
LAB_0013c428:
        parts._a = (String *)0x0;
        String::operator=((String *)&parts,s);
      }
      else {
        if (parts_1._a[1]._size == 0) {
          paVar8 = &parts_1._a[1].field_2;
        }
        else {
          paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)parts_1._a[1].field_2._str;
        }
        cVar1 = paVar8->_space[0];
        if ((((1 < *(int *)&parts_1._a[-1].field_2) && (1 < parts_1._a[1]._len)) &&
            (bVar2 = String::contains(parts_1._a + 1,'|'), bVar2)) ||
           (parts._a = (String *)0x0, cVar1 == 'c')) {
          parts._a = (String *)0x0;
          pSVar7 = String::replaceme(parts_1._a + 1,'|',',');
          operator+(&local_60,'{',pSVar7);
          String::operator+(&local_48,&local_60,'}');
          String::operator=((String *)&parts,&local_48);
          String::~String(&local_48);
          String::~String(&local_60);
        }
        else {
          s = "string";
          if (cVar1 == 's') goto LAB_0013c428;
          if (cVar1 == 'n') goto LAB_0013c421;
        }
      }
      pTVar6 = TextFile::operator<<(&this->_file,"@attribute ");
      pTVar6 = TextFile::operator<<(pTVar6,parts_1._a);
      local_48._size._0_1_ = 0x20;
      pTVar6 = TextFile::operator<<(pTVar6,(char *)&local_48);
      pTVar6 = TextFile::operator<<(pTVar6,(String *)&parts);
      local_60._size._0_1_ = 10;
      TextFile::operator<<(pTVar6,(char *)&local_60);
      String::~String((String *)&parts);
      Array<asl::String>::~Array(&parts_1);
    }
    TextFile::operator<<(&this->_file,"\n@data\n");
  }
  else {
    String::String((String *)&parts,this->_separator);
    Array<asl::String>::join(&rel,&this->_columnNames,(String *)&parts);
    String::~String((String *)&parts);
    TextFile::operator<<(&this->_file,&rel);
  }
  String::~String(&rel);
  return this;
}

Assistant:

TabularDataFile& TabularDataFile::columns(const Array<String>& cols)
{
	if(_separator == '\0')
		_separator = ',';

	if(_columnNames.length() == 0)
	{
		_file.open(_name, File::WRITE);
		if(!_file)
		{
			return *this;
		}
		foreach(String& col, cols)
		{
			Array<String> parts = col.split(':');
			_columnNames << parts[0];
		}
	}
	if(_name.toLowerCase().endsWith(".arff"))
	{
		_quote = '\'';
		_equote = String::repeat(_quote, 2);
		int i1 = max(max(_name.lastIndexOf('/')+1, _name.lastIndexOf('\\')+1), 0);
		int i2 = _name.lastIndexOf('.');
		String rel = _name.substring(i1, i2);
		_file << "@relation " << rel << "\n\n";

		foreach(String& col, cols)
		{
			Array<String> parts = col.split(':');
			char typec = (parts.length()==1)? 'n' : parts[1][0];
			if(parts.length() > 1 && parts[1].length() > 1 && parts[1].contains('|'))
				typec = 'c';
			String type;
			switch(typec)
			{
			case 'n':
				type = "numeric";
				break;
			case 's':
				type = "string";
				break;
			case 'c':
				type = '{' + parts[1].replaceme('|', ',') + '}';
			}
			_file << "@attribute " << parts[0] << ' ' << type << '\n';
		}
		_file << "\n@data\n";
	}
	else
	{
		String header = _columnNames.join(_separator);
		_file << header;
	}
	return *this;
}